

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O1

void __thiscall cp::PlanFootprints::whichWalkOrStep(PlanFootprints *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  
  if (1 < *(int *)(this + 0x308) - 1U) {
    return;
  }
  if ((((*(double *)(this + 0x2e8) != 0.0) || (NAN(*(double *)(this + 0x2e8)))) ||
      (*(double *)(this + 0x2f0) != 0.0)) || (NAN(*(double *)(this + 0x2f0)))) {
    uVar2 = 1;
    uVar3 = 9;
    uVar1 = 1;
    if (*(int *)this != 2) goto LAB_00109689;
  }
  else {
    uVar2 = 2;
    uVar3 = 8;
    uVar1 = 2;
    if (*(int *)this != 1) goto LAB_00109689;
  }
  uVar2 = uVar1;
  *(undefined4 *)(this + 0x308) = uVar3;
LAB_00109689:
  *(undefined4 *)this = uVar2;
  return;
}

Assistant:

void PlanFootprints::whichWalkOrStep() {
  if (wstate != walk && wstate != step) {return;}
  if (step_vector.x() != 0.0 || step_vector.y() != 0.0) {
    if (whichwalk == step) {
      wstate = step2walk;
    }
    whichwalk = walk;
  } else {
    if (whichwalk == walk) {
      wstate = walk2step;
    }
    whichwalk = step;
  }
}